

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLOutput.cpp
# Opt level: O2

void __thiscall
Test::HTMLOutput::generateTestsTable
          (HTMLOutput *this,ostream *stream,SuiteInfo *suite,bool includePassed)

{
  pointer pAVar1;
  pointer pAVar2;
  pointer pAVar3;
  ostream *poVar4;
  long lVar5;
  pointer pAVar6;
  size_t totalTests;
  pointer methodName;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  string local_90;
  string local_70;
  string local_50;
  
  poVar4 = std::operator<<(stream,"<table id=\'suite_");
  poVar4 = std::operator<<(poVar4,(string *)suite);
  poVar4 = std::operator<<(poVar4,"\'>");
  poVar4 = std::operator<<(poVar4,
                           "<tr><th>Test-method</th><th># Assertions</th><th>Passed Assertions</th><th>Failures</th></tr>"
                          );
  std::endl<char,std::char_traits<char>>(poVar4);
  for (methodName = (suite->methods).
                    super__Vector_base<Test::CollectorOutput::TestMethodInfo,_std::allocator<Test::CollectorOutput::TestMethodInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      methodName !=
      (suite->methods).
      super__Vector_base<Test::CollectorOutput::TestMethodInfo,_std::allocator<Test::CollectorOutput::TestMethodInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish; methodName = methodName + 1) {
    pAVar6 = (methodName->failedAssertions).
             super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pAVar1 = (methodName->passedAssertions).
             super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pAVar2 = (methodName->passedAssertions).
             super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
             super__Vector_impl_data._M_start;
    pAVar3 = (methodName->failedAssertions).
             super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
             super__Vector_impl_data._M_start;
    poVar4 = std::operator<<(stream,"<tr><td>");
    Output::stripMethodName(&local_50,(Output *)this,&methodName->methodName);
    poVar4 = std::operator<<(poVar4,(string *)&local_50);
    poVar4 = std::operator<<(poVar4,"(");
    Output::truncateString(&local_70,(Output *)this,&methodName->argString,0x14);
    poVar4 = std::operator<<(poVar4,(string *)&local_70);
    poVar4 = std::operator<<(poVar4,")</td>");
    poVar4 = std::operator<<(poVar4,"<td>");
    totalTests = ((long)pAVar6 - (long)pAVar3) / 200 + ((long)pAVar1 - (long)pAVar2) / 200;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,"</td>");
    poVar4 = std::operator<<(poVar4,"<td class=\'");
    getCssClass_abi_cxx11_
              (&local_90,totalTests,
               ((long)(methodName->passedAssertions).
                      super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(methodName->passedAssertions).
                     super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
                     super__Vector_impl_data._M_start) / 200);
    poVar4 = std::operator<<(poVar4,(string *)&local_90);
    poVar4 = std::operator<<(poVar4,"\'>");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4," (");
    lVar5 = ((long)(methodName->passedAssertions).
                   super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(methodName->passedAssertions).
                  super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
                  super__Vector_impl_data._M_start) / 200;
    auVar8._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar8._0_8_ = lVar5;
    auVar8._12_4_ = 0x45300000;
    auVar9._8_4_ = (int)(totalTests >> 0x20);
    auVar9._0_8_ = totalTests;
    auVar9._12_4_ = 0x45300000;
    dVar7 = Output::prettifyPercentage
                      ((Output *)this,
                       (auVar8._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0),
                       (auVar9._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)totalTests) - 4503599627370496.0));
    poVar4 = std::ostream::_M_insert<double>(dVar7);
    poVar4 = std::operator<<(poVar4,"%)</td>");
    std::operator<<(poVar4,"<td>");
    std::__cxx11::string::~string(&local_90);
    std::__cxx11::string::~string(&local_70);
    std::__cxx11::string::~string(&local_50);
    for (pAVar6 = (methodName->failedAssertions).
                  super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pAVar6 != (methodName->failedAssertions).
                  super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
                  super__Vector_impl_data._M_finish; pAVar6 = pAVar6 + 1) {
      poVar4 = std::operator<<(stream,"<span class=\'message\'><a href=\'file://");
      poVar4 = std::operator<<(poVar4,(string *)&pAVar6->file);
      poVar4 = std::operator<<(poVar4,"\'>");
      poVar4 = std::operator<<(poVar4,(string *)&pAVar6->file);
      poVar4 = std::operator<<(poVar4,"</a>: ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,": ");
      Output::truncateString
                (&local_50,(Output *)this,
                 &pAVar6->errorMessage + ((pAVar6->errorMessage)._M_string_length == 0),0x3e);
      poVar4 = std::operator<<(poVar4,(string *)&local_50);
      std::operator<<(poVar4,"</span>");
      std::__cxx11::string::~string(&local_50);
    }
    poVar4 = std::operator<<(stream,"</td>");
    poVar4 = std::operator<<(poVar4,"</tr>");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  poVar4 = std::operator<<(stream,"</table>");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(stream,"<a href=\'#top\'>Back to top</a>");
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void HTMLOutput::generateTestsTable(std::ostream &stream, const SuiteInfo &suite, bool includePassed) {
  stream << "<table id='suite_" << suite.suiteName << "'>"
         << "<tr><th>Test-method</th><th># Assertions</th><th>Passed Assertions</th><th>Failures</th></tr>"
         << std::endl;
  // content
  auto testMethod = suite.methods.begin();
  while (testMethod != suite.methods.end()) {
    std::size_t totalAssertions = testMethod->passedAssertions.size() + testMethod->failedAssertions.size();
    stream << "<tr><td>" << stripMethodName(testMethod->methodName) << "(" << truncateString(testMethod->argString, 20)
           << ")</td>"
           << "<td>" << totalAssertions << "</td>"
           << "<td class='" << getCssClass(totalAssertions, testMethod->passedAssertions.size()) << "'>"
           << testMethod->passedAssertions.size() << " ("
           << prettifyPercentage(
                  static_cast<double>(testMethod->passedAssertions.size()), static_cast<double>(totalAssertions))
           << "%)</td>"
           << "<td>";
    auto assertion = testMethod->failedAssertions.begin();
    while (assertion != testMethod->failedAssertions.end()) {
      stream << "<span class='message'><a href='file://" << assertion->file << "'>" << assertion->file
             << "</a>: " << assertion->lineNumber << ": "
             << truncateString(
                    (!assertion->errorMessage.empty() ? assertion->errorMessage : assertion->userMessage), 62)
             << "</span>";
      ++assertion;
    }
    stream << "</td>"
           << "</tr>" << std::endl;
    ++testMethod;
  }
  stream << "</table>" << std::endl;
  stream << "<a href='#top'>Back to top</a>" << std::endl;
}